

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::it_starting(xunit *this,string *desc)

{
  int *piVar1;
  ostream *poVar2;
  rep rVar3;
  string sStack_68;
  string local_48;
  
  piVar1 = &(this->super_progress_base).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"\t<testcase classname=\"");
  progress_base::current_context_name_abi_cxx11_(&local_48,&this->super_progress_base);
  escape(&sStack_68,this,&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
  std::operator<<(poVar2,"\" ");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"name=\"");
  escape(&sStack_68,this,desc);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string((string *)&sStack_68);
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->testcase_start_time_point_).__d.__r = rVar3;
  return;
}

Assistant:

void it_starting(const std::string& desc) override {
        progress_base::it_starting(desc);
        work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
        work_stm_ << "name=\"" << escape(desc) << "\"";
        testcase_start_time_point_ = std::chrono::high_resolution_clock::now();
      }